

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O0

char16_t * PAL_wcschr(char16_t *string,char16_t c)

{
  char16_t *pcStack_18;
  char16_t c_local;
  char16_t *string_local;
  
  pcStack_18 = string;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  while( true ) {
    if (*pcStack_18 == L'\0') {
      if (*pcStack_18 == c) {
        string_local = pcStack_18;
      }
      else {
        if (!PAL_InitializeChakraCoreCalled) {
          abort();
        }
        string_local = (char16_t *)0x0;
      }
      return string_local;
    }
    if (*pcStack_18 == c) break;
    pcStack_18 = pcStack_18 + 1;
  }
  if (PAL_InitializeChakraCoreCalled) {
    return pcStack_18;
  }
  abort();
}

Assistant:

char16_t _WConst_return *
__cdecl
PAL_wcschr(
        const char16_t * string,
        char16_t c)
{
    PERF_ENTRY(wcschr);
    ENTRY("wcschr (string=%p (%S), c=%C)\n", string?string:W16_NULLSTRING, string?string:W16_NULLSTRING, c);

    while (*string)
    {
        if (*string == c)
        {
            LOGEXIT("wcschr returning char16_t %p (%S)\n", string?string:W16_NULLSTRING, string?string:W16_NULLSTRING);
            PERF_EXIT(wcschr);
            return (char16_t *) string;
        }
        string++;
    }

    // Check if the comparand was \000
    if (*string == c)
        return (char16_t *) string;

    LOGEXIT("wcschr returning char16_t NULL\n");
    PERF_EXIT(wcschr);
    return NULL;
}